

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

bool __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>::
can_be_inserted(storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag> *this,
               size_t hash,int constraints)

{
  pointer prVar1;
  long lVar2;
  long lVar3;
  m_indices_reader lock;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_owns = true;
  local_28._M_pm = &this->m_indices_mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  prVar1 = (this->m_data).
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (ulong)(uint)this->m_size * 0x38;
  for (lVar3 = 0;
      (lVar2 - lVar3 != 0 &&
      ((*(int *)((long)&prVar1->remaining_constraints + lVar3) != constraints ||
       (*(size_t *)((long)&prVar1->hash + lVar3) != hash)))); lVar3 = lVar3 + 0x38) {
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  return lVar2 - lVar3 == 0;
}

Assistant:

bool can_be_inserted(const std::size_t hash, const int constraints) const
      noexcept
    {
        m_indices_reader lock(m_indices_mutex);

        for (int i = 0; i != m_size; ++i)
            if (m_data[i].remaining_constraints == constraints &&
                m_data[i].hash == hash)
                return false;

        return true;
    }